

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

void Wln_ObjSetConst(Wln_Ntk_t *p,int iObj,int NameId)

{
  int iVar1;
  int NameId_local;
  int iObj_local;
  Wln_Ntk_t *p_local;
  
  iVar1 = Wln_ObjIsConst(p,iObj);
  if (iVar1 != 0) {
    Wln_ObjSetFanin(p,iObj,0,NameId);
    return;
  }
  __assert_fail("Wln_ObjIsConst(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                ,0x43,"void Wln_ObjSetConst(Wln_Ntk_t *, int, int)");
}

Assistant:

void Wln_ObjSetConst( Wln_Ntk_t * p, int iObj, int NameId )
{
    assert( Wln_ObjIsConst(p, iObj) );
    Wln_ObjSetFanin( p, iObj, 0, NameId );
}